

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O2

_Bool monster_scared_by_damage(monster_conflict *mon,wchar_t dam)

{
  short sVar1;
  bool bVar2;
  _Bool _Var3;
  uint32_t uVar4;
  uint32_t uVar5;
  wchar_t timer;
  int iVar6;
  
  sVar1 = mon->m_timed[3];
  if (sVar1 == 0) {
    _Var3 = monster_can_be_scared((monster *)mon);
    if (_Var3) {
      iVar6 = (mon->hp * 100) / (int)mon->maxhp;
      uVar4 = Rand_div(10);
      if (dam < mon->hp) {
        bVar2 = false;
      }
      else {
        uVar5 = Rand_div(100);
        bVar2 = (int)uVar5 < 0x50;
      }
      if ((iVar6 <= (int)(uVar4 + 1)) || (bVar2)) {
        uVar4 = Rand_div(10);
        if ((dam < mon->hp) || (iVar6 < 8)) {
          timer = uVar4 + (0xb - iVar6) * 5 + L'\x01';
        }
        else {
          timer = uVar4 + L'\x15';
        }
        mon_inc_timed((monster *)mon,L'\x03',timer,L'\f');
        return true;
      }
    }
  }
  else {
    uVar4 = Rand_div(dam);
    if (uVar4 + L'\x01' < (int)sVar1) {
      mon_dec_timed((monster *)mon,L'\x03',uVar4 + L'\x01',L'\x04');
    }
    else {
      mon_clear_timed((monster *)mon,L'\x03',L'\x04');
    }
  }
  return false;
}

Assistant:

static bool monster_scared_by_damage(struct monster *mon, int dam)
{
	int current_fear = mon->m_timed[MON_TMD_FEAR];

	/* Pain can reduce or cancel existing fear, or cause fear */
	if (current_fear) {
		int tmp = randint1(dam);

		/* Cure a little or all fear */
		if (tmp < current_fear) {
			/* Reduce fear */
			mon_dec_timed(mon, MON_TMD_FEAR, tmp, MON_TMD_FLG_NOMESSAGE);
		} else {
			/* Cure fear */
			mon_clear_timed(mon, MON_TMD_FEAR, MON_TMD_FLG_NOMESSAGE);
			return false;
		}
	} else if (monster_can_be_scared(mon)) {
		/* Percentage of fully healthy */
		int percentage = (100L * mon->hp) / mon->maxhp;

		/* Run (sometimes) if at 10% or less of max hit points... */
		bool low_hp = randint1(10) >= percentage;

		/* ...or (usually) when hit for half its current hit points */
		bool big_hit = (dam >= mon->hp) && (randint0(100) < 80);

		if (low_hp || big_hit) {
			int time = randint1(10);
			if ((dam >= mon->hp) && (percentage > 7)) {
				time += 20;
			} else {
				time += (11 - percentage) * 5;
			}

			/* Note fear */
			mon_inc_timed(mon, MON_TMD_FEAR, time,
						  MON_TMD_FLG_NOMESSAGE | MON_TMD_FLG_NOFAIL);
			return true;
		}
	}
	return false;
}